

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O0

VertexPacket * __thiscall rr::pa::Line::getProvokingVertex(Line *this)

{
  Line *this_local;
  
  if (this->provokingIndex == 0) {
    this_local = (Line *)this->v0;
  }
  else if (this->provokingIndex == 1) {
    this_local = (Line *)this->v1;
  }
  else {
    this_local = (Line *)0x0;
  }
  return (VertexPacket *)this_local;
}

Assistant:

VertexPacket* getProvokingVertex (void)
	{
		switch (provokingIndex)
		{
			case 0: return v0;
			case 1: return v1;
			default:
				DE_ASSERT(false);
				return DE_NULL;
		}
	}